

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

size_t testing::internal::GetThreadCount(void)

{
  ostream *this;
  __pid_t _Var1;
  int iVar2;
  string filename;
  string dummy;
  ifstream file;
  
  Message::Message((Message *)&file);
  this = (ostream *)(_file + 0x10);
  std::operator<<(this,"/proc/");
  _Var1 = getpid();
  std::ostream::operator<<(this,_Var1);
  std::operator<<(this,"/stat");
  StringStreamToString(&filename,_file);
  if (_file != (stringstream *)0x0) {
    (**(code **)(*(long *)_file + 8))(_file);
  }
  dummy._M_dataplus._M_p = (pointer)&dummy.field_2;
  dummy._M_string_length = 0;
  dummy.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream((istream *)&file,filename._M_dataplus._M_p,_S_in);
  for (iVar2 = -0x13; iVar2 != 0; iVar2 = iVar2 + 1) {
    std::operator>>((istream *)&file,(string *)&dummy);
  }
  std::istream::_M_extract<unsigned_long>((ulong *)&file);
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return 0;
}

Assistant:

size_t GetThreadCount() {
  const std::string filename =
      (Message() << "/proc/" << getpid() << "/stat").GetString();
  return ReadProcFileField<size_t>(filename, 19);
}